

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

VectorSet *
AlphaVectorPlanning::ValueFunctionToVectorSet
          (VectorSet *__return_storage_ptr__,ValueFunctionPOMDPDiscrete *V)

{
  pointer pAVar1;
  long lVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  long lVar6;
  size_type sVar7;
  size_type __n;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar6 == 0) {
    (__return_storage_ptr__->data_).size_ = 0;
    (__return_storage_ptr__->data_).data_ = (pointer)0x0;
    __return_storage_ptr__->size1_ = 0;
    __return_storage_ptr__->size2_ = 0;
  }
  else {
    sVar7 = (lVar6 >> 3) * -0x3333333333333333;
    uVar10 = (ulong)((long)*(pointer *)
                            ((long)&(pAVar1->_m_values).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl + 8)
                    - *(long *)&(pAVar1->_m_values).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data) >> 3;
    iVar9 = (int)uVar10;
    uVar10 = uVar10 & 0xffffffff;
    __return_storage_ptr__->size1_ = sVar7;
    __return_storage_ptr__->size2_ = uVar10;
    __n = sVar7 * uVar10;
    (__return_storage_ptr__->data_).size_ = __n;
    if (__n == 0) {
      pdVar5 = (double *)0x0;
    }
    else {
      pdVar5 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)&__return_storage_ptr__->data_,__n,(void *)0x0);
    }
    (__return_storage_ptr__->data_).data_ = pdVar5;
    pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pAVar1;
    if (lVar6 != 0) {
      uVar10 = 0;
      do {
        if (iVar9 != 0) {
          lVar2 = *(long *)&pAVar1[uVar10]._m_values.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl;
          pdVar3 = *(pointer *)
                    ((long)&pAVar1[uVar10]._m_values.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
          sVar7 = __return_storage_ptr__->size2_;
          pdVar4 = (__return_storage_ptr__->data_).data_;
          uVar8 = 0;
          do {
            if ((ulong)((long)pdVar3 - lVar2 >> 3) <= uVar8) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            pdVar4[sVar7 * uVar10 + uVar8] = *(double *)(lVar2 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (iVar9 != (int)uVar8);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      } while ((lVar6 >> 3) * -0x3333333333333333 - uVar10 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

VectorSet AlphaVectorPlanning::ValueFunctionToVectorSet(const ValueFunctionPOMDPDiscrete& V)
{
    if(V.size()==0)
        return(VectorSet());
    else
    {
        size_t nrS=V[0].GetNrValues();
        VectorSet VS(V.size(),nrS);
        for(Index i=0;i!=V.size();++i)
            for(Index s=0;s!=nrS;++s)
                VS(i,s)=V[i].GetValue(s);
        return(VS);
    }
}